

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAdapter.cpp
# Opt level: O3

void __thiscall OpenMD::DirectionalAdapter::makeDirectional(DirectionalAdapter *this,Mat3x3d *I)

{
  undefined8 *puVar1;
  AtomType *this_00;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  DirectionalAtypeParameters directionalParam;
  undefined1 local_79;
  SimpleTypeData<OpenMD::DirectionalAtypeParameters> *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<OpenMD::GenericData> local_68;
  DirectionalAtypeParameters local_58;
  
  bVar3 = AtomType::hasProperty(this->at_,(string *)DirectionalTypeID_abi_cxx11_);
  if (bVar3) {
    AtomType::removeProperty(this->at_,(string *)DirectionalTypeID_abi_cxx11_);
  }
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  if (&local_58 != (DirectionalAtypeParameters *)I) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar4 + 0x10) =
           *(undefined8 *)
            ((long)(I->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
            lVar4 + 0x10);
      puVar1 = (undefined8 *)
               ((long)(I->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               lVar4);
      uVar2 = puVar1[1];
      *(undefined8 *)
       ((long)local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar4) = *puVar1;
      *(undefined8 *)
       ((long)local_58.I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar4 + 8) = uVar2;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
  }
  this_00 = this->at_;
  local_78 = (SimpleTypeData<OpenMD::DirectionalAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>>,std::__cxx11::string_const&,OpenMD::DirectionalAtypeParameters&>
            (&_Stack_70,&local_78,
             (allocator<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>_> *)&local_79,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DirectionalTypeID_abi_cxx11_,&local_58);
  local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_78->super_GenericData;
  local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (SimpleTypeData<OpenMD::DirectionalAtypeParameters> *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_68);
  if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  return;
}

Assistant:

void DirectionalAdapter::makeDirectional(Mat3x3d I) {
    if (isDirectional()) { at_->removeProperty(DirectionalTypeID); }

    DirectionalAtypeParameters directionalParam {};

    directionalParam.I = I;

    at_->addProperty(std::make_shared<DirectionalAtypeData>(DirectionalTypeID,
                                                            directionalParam));
  }